

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execDivs<(moira::Core)0,(moira::Instr)54,(moira::Mode)11,2>(Moira *this,u16 opcode)

{
  bool local_13;
  u16 local_12;
  bool divByZero;
  Moira *pMStack_10;
  u16 opcode_local;
  Moira *this_local;
  
  local_13 = false;
  local_12 = opcode;
  pMStack_10 = this;
  execDivsMusashi<(moira::Core)0,(moira::Instr)54,(moira::Mode)11,2>(this,opcode,&local_13);
  if ((local_13 & 1U) == 0) {
    (*this->_vptr_Moira[2])(this,0xa2);
  }
  else {
    (*this->_vptr_Moira[2])(this,0x26);
  }
  return;
}

Assistant:

void
Moira::execDivs(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    bool divByZero = false;

    if constexpr (MOIRA_MIMIC_MUSASHI) {
        execDivsMusashi<C, I, M, S>(opcode, &divByZero);
    } else {
        execDivsMoira<C, I, M, S>(opcode, &divByZero);
    }

    if (divByZero) {

        CYCLES_68000(38);
        CYCLES_68010(44);
        CYCLES_68020(38);

    } else {

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_DN   ( 0,  0,  0,      158,122, 56,        0,  0,  0)
        CYCLES_AI   ( 0,  0,  0,      162,126, 60,        0,  0,  0)
        CYCLES_PI   ( 0,  0,  0,      162,126, 60,        0,  0,  0)
        CYCLES_PD   ( 0,  0,  0,      164,128, 61,        0,  0,  0)
        CYCLES_DI   ( 0,  0,  0,      166,130, 61,        0,  0,  0)
        CYCLES_IX   ( 0,  0,  0,      168,132, 63,        0,  0,  0)
        CYCLES_AW   ( 0,  0,  0,      166,130, 60,        0,  0,  0)
        CYCLES_AL   ( 0,  0,  0,      170,134, 60,        0,  0,  0)
        CYCLES_DIPC ( 0,  0,  0,      166,130, 61,        0,  0,  0)
        CYCLES_IXPC ( 0,  0,  0,      168,132, 63,        0,  0,  0)
        CYCLES_IM   ( 0,  0,  0,      162,126, 58,        0,  0,  0)
    }

    FINALIZE
}